

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

void __thiscall Hand::Hand(Hand *this,Hand *toCopy)

{
  vector<CardType,_std::allocator<CardType>_> *this_00;
  vector<CardType,_std::allocator<CardType>_> *this_01;
  size_type __n;
  allocator<CardType> local_25 [13];
  Hand *local_18;
  Hand *toCopy_local;
  Hand *this_local;
  
  local_18 = toCopy;
  toCopy_local = this;
  this_00 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  this_01 = getHand(local_18);
  __n = std::vector<CardType,_std::allocator<CardType>_>::size(this_01);
  std::allocator<CardType>::allocator(local_25);
  std::vector<CardType,_std::allocator<CardType>_>::vector(this_00,__n,local_25);
  this->handPointer = this_00;
  std::allocator<CardType>::~allocator(local_25);
  std::vector<CardType,_std::allocator<CardType>_>::operator=
            (this->handPointer,local_18->handPointer);
  return;
}

Assistant:

Hand::Hand(Hand &toCopy) {
    handPointer = new std::vector<CardType>(toCopy.getHand()->size());
    *handPointer = *toCopy.handPointer;
}